

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

void __thiscall
chrono::utils::Generator::CreateObjectsBox
          (Generator *this,ChVector<double> *dist,ChVector<double> *pos,ChVector<double> *hdims,
          ChVector<double> *vel)

{
  undefined8 uVar1;
  pointer pCVar2;
  int iVar3;
  PointVector points;
  GridSampler<double> sampler;
  undefined1 local_c8 [16];
  pointer local_b8;
  undefined1 local_a8 [16];
  pointer pCStack_98;
  Sampler<double> local_88;
  _func_int **local_48;
  double local_40;
  double local_38;
  
  normalizeMixture(this);
  iVar3 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                    ();
  if (iVar3 == 1) {
    calcMinSeparation((ChVector<double> *)&local_88,this,dist);
    local_38 = local_88.m_center.m_data[0];
    local_48 = local_88._vptr_Sampler;
  }
  else {
    local_48 = (_func_int **)dist->m_data[0];
    local_88.m_separation = dist->m_data[1];
    local_38 = dist->m_data[2];
  }
  local_88.m_center.m_data[0] = 0.0;
  local_88.m_center.m_data[1] = 0.0;
  local_88.m_center.m_data[2] = 0.0;
  local_88.m_size.m_data[0] = 0.0;
  local_88.m_size.m_data[1] = 0.0;
  local_88.m_size.m_data[2] = 0.0;
  local_88._vptr_Sampler = (_func_int **)&PTR__Sampler_00b74a90;
  local_c8 = ZEXT816(0) << 0x20;
  local_b8 = (pointer)0x0;
  local_40 = local_88.m_separation;
  local_88.m_separation = (double)local_48;
  Sampler<double>::SampleBox((PointVector *)local_a8,&local_88,pos,hdims);
  pCVar2 = local_b8;
  uVar1 = local_c8._0_8_;
  local_c8._0_8_ = local_a8._0_8_;
  local_b8 = pCStack_98;
  local_a8 = ZEXT816(0) << 0x20;
  pCStack_98 = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)pCVar2 - uVar1);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_,(long)pCStack_98 - local_a8._0_8_);
  }
  createObjects(this,(PointVector *)local_c8,vel);
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._0_8_,(long)local_b8 - local_c8._0_8_);
  }
  return;
}

Assistant:

void Generator::CreateObjectsBox(const ChVector<>& dist,
                                 const ChVector<>& pos,
                                 const ChVector<>& hdims,
                                 const ChVector<>& vel) {
    // Normalize the mixture ratios
    normalizeMixture();

    // When using SMC, make sure there is no shape overlap.
    ChVector<> distv;
    if (m_system->GetContactMethod() == ChContactMethod::SMC)
        distv = calcMinSeparation(dist);
    else
        distv = dist;

    // Generate the object locations
    GridSampler<> sampler(distv);
    PointVector points;
    points = sampler.SampleBox(pos, hdims);

    createObjects(points, vel);
}